

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O3

void __thiscall GetUniquePathTest_PMIx_Test::TestBody(GetUniquePathTest_PMIx_Test *this)

{
  size_type *psVar1;
  size_type *psVar2;
  char *pcVar3;
  undefined1 local_158 [8];
  WithEnv rank;
  WithEnv withTestVar;
  char *expectedParent;
  string expectedChild;
  WithEnv withForced;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  psVar2 = &withTestVar.var._M_string_length;
  rank.val.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&rank.val.field_2 + 8),"PMIX_RANK","");
  psVar1 = &withForced.var._M_string_length;
  expectedChild.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedChild.field_2 + 8),"5","");
  WithEnv::WithEnv((WithEnv *)local_158,(string *)((long)&rank.val.field_2 + 8),
                   (string *)((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if ((size_type *)rank.val.field_2._8_8_ != psVar2) {
    operator_delete((void *)rank.val.field_2._8_8_,withTestVar.var._M_string_length + 1);
  }
  expectedChild.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedChild.field_2 + 8),"GPROF_TEST_PATH","");
  psVar2 = &expectedChild._M_string_length;
  expectedParent = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&expectedParent,"/var/log/some_file_name","");
  WithEnv::WithEnv((WithEnv *)((long)&rank.val.field_2 + 8),
                   (string *)((long)&expectedChild.field_2 + 8),(string *)&expectedParent);
  if ((size_type *)expectedParent != psVar2) {
    operator_delete(expectedParent,expectedChild._M_string_length + 1);
  }
  if ((size_type *)expectedChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  withTestVar.val.field_2._8_8_ = anon_var_dwarf_51ff;
  expectedChild.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedChild.field_2 + 8),"/var/log/some_file_name.rank-5","");
  AppendPID((string *)&expectedParent,(string *)((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)local_48,"expectedParent","GetTestPath()",
             (char **)((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedChild.field_2 + 8));
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedChild.field_2._8_8_ + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_48,"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedChild.field_2 + 8));
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedChild.field_2._8_8_ + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  setenv((char *)rank.val.field_2._8_8_,(char *)withTestVar.var.field_2._8_8_,1);
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"GPROF_TEST_PATH_USE_PID","");
  withForced.val.field_2._8_8_ = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withForced.val.field_2 + 8),"1","");
  WithEnv::WithEnv((WithEnv *)((long)&expectedChild.field_2 + 8),(string *)local_48,
                   (string *)((long)&withForced.val.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)withForced.val.field_2._8_8_ != &local_60) {
    operator_delete((void *)withForced.val.field_2._8_8_,local_60._M_allocated_capacity + 1);
  }
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedParent != psVar2) {
    operator_delete(expectedParent,expectedChild._M_string_length + 1);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&rank.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_158);
  return;
}

Assistant:

TEST(GetUniquePathTest, PMIx) {
  WithEnv rank("PMIX_RANK", "5");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  const auto expectedParent = TEST_VAL ".rank-5";
  const auto expectedChild = AppendPID(expectedParent);

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedParent, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedChild, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedChild, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedChild, GetTestPath());
}